

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

ObjPipeline * rw::ObjPipeline::create(void)

{
  ObjPipeline *pOVar1;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/pipeline.cpp line: 31"
  ;
  pOVar1 = (ObjPipeline *)(*DAT_00148858)(0x28,0x40000);
  (pOVar1->super_Pipeline).pluginID = 0;
  (pOVar1->super_Pipeline).pluginData = 0;
  (pOVar1->super_Pipeline).platform = 0;
  (pOVar1->impl).instance = nothing;
  (pOVar1->impl).uninstance = nothing;
  (pOVar1->impl).render = nothing;
  return pOVar1;
}

Assistant:

ObjPipeline*
ObjPipeline::create(void)
{
	ObjPipeline *pipe = rwNewT(ObjPipeline, 1, MEMDUR_GLOBAL);
	pipe->init(PLATFORM_NULL);
	return pipe;
}